

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O1

int record_pool_block(amqp_pool_blocklist_t *x,void *block)

{
  size_t __size;
  int iVar1;
  void **ppvVar2;
  
  __size = (long)x->num_blocks * 8 + 8;
  if (x->blocklist == (void **)0x0) {
    ppvVar2 = (void **)malloc(__size);
    x->blocklist = ppvVar2;
    if (ppvVar2 == (void **)0x0) {
      return 0;
    }
  }
  else {
    ppvVar2 = (void **)realloc(x->blocklist,__size);
    if (ppvVar2 == (void **)0x0) {
      return 0;
    }
    x->blocklist = ppvVar2;
  }
  iVar1 = x->num_blocks;
  x->blocklist[iVar1] = block;
  x->num_blocks = iVar1 + 1;
  return 1;
}

Assistant:

static int record_pool_block(amqp_pool_blocklist_t *x, void *block)
{
  size_t blocklistlength = sizeof(void *) * (x->num_blocks + 1);

  if (x->blocklist == NULL) {
    x->blocklist = malloc(blocklistlength);
    if (x->blocklist == NULL) {
      return 0;
    }
  } else {
    void *newbl = realloc(x->blocklist, blocklistlength);
    if (newbl == NULL) {
      return 0;
    }
    x->blocklist = newbl;
  }

  x->blocklist[x->num_blocks] = block;
  x->num_blocks++;
  return 1;
}